

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode
JsDeleteProperty(JsValueRef object,JsPropertyIdRef propertyId,bool useStrictRules,JsValueRef *result
                )

{
  anon_class_32_4_504d7b58 fn;
  JsErrorCode JVar1;
  JsValueRef *local_28;
  JsValueRef *result_local;
  JsPropertyIdRef pvStack_18;
  bool useStrictRules_local;
  JsPropertyIdRef propertyId_local;
  JsValueRef object_local;
  
  fn.propertyId = (JsPropertyIdRef *)((long)&result_local + 7);
  fn.object = &stack0xffffffffffffffe8;
  fn.useStrictRules = (bool *)&local_28;
  fn.result = (JsValueRef **)&propertyId_local;
  local_28 = result;
  result_local._7_1_ = useStrictRules;
  pvStack_18 = propertyId;
  propertyId_local = object;
  JVar1 = ContextAPIWrapper<false,JsDeleteProperty::__0>(fn);
  return JVar1;
}

Assistant:

CHAKRA_API JsDeleteProperty(_In_ JsValueRef object, _In_ JsPropertyIdRef propertyId,
    _In_ bool useStrictRules, _Out_ JsValueRef *result)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&] (Js::ScriptContext *scriptContext,
        TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTDeleteProperty, object, (const Js::PropertyRecord *)propertyId, useStrictRules);

        VALIDATE_INCOMING_OBJECT(object, scriptContext);
        VALIDATE_INCOMING_PROPERTYID(propertyId);
        PARAM_NOT_NULL(result);
        *result = nullptr;

        JsErrorCode err = JsDeletePropertyCommon(scriptContext, object, (const Js::PropertyRecord *)propertyId,
            useStrictRules, result);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, result);

        return err;
    });
}